

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ports.cpp
# Opt level: O2

int rtosc::enum_key_from_msg(MetaContainer meta,char *msg)

{
  char cVar1;
  int iVar2;
  rtosc_arg_t rVar3;
  
  cVar1 = rtosc_type(msg,0);
  if ((cVar1 != 'i') && (cVar1 != 'c')) {
    rVar3 = rtosc_argument(msg,0);
    iVar2 = enum_key(meta,rVar3.s);
    return iVar2;
  }
  rVar3 = rtosc_argument(msg,0);
  return rVar3._0_4_;
}

Assistant:

int rtosc::enum_key_from_msg(Port::MetaContainer meta, const char* msg)
{
    char type = rtosc_type(msg, 0);
    int val = (type == 'i' || type == 'c')
        ? rtosc_argument(msg, 0).i
        : enum_key(meta, rtosc_argument(msg, 0).s);
    assert(!meta["min"] || val >= atoi(meta["min"]));
    assert(!meta["max"] || val <= atoi(meta["max"]));
    return val;
}